

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.cpp
# Opt level: O0

double __thiscall jrtplib::RTPSourceData::INF_GetEstimatedTimestampUnit(RTPSourceData *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  RTPNTPTime ntptime;
  double dVar4;
  uint32_t tsdiff;
  RTPTime local_30;
  RTPTime t2;
  RTPTime local_20;
  RTPTime t1;
  RTPSourceData *this_local;
  
  t1.m_t = (double)this;
  bVar1 = RTCPSenderReportInfo::HasInfo(&this->SRprevinf);
  if (bVar1) {
    t2.m_t = (double)RTCPSenderReportInfo::GetNTPTimestamp(&this->SRinf);
    RTPTime::RTPTime(&local_20,(RTPNTPTime)t2.m_t);
    ntptime = RTCPSenderReportInfo::GetNTPTimestamp(&this->SRprevinf);
    RTPTime::RTPTime(&local_30,ntptime);
    bVar1 = RTPTime::IsZero(&local_20);
    if ((!bVar1) && (bVar1 = RTPTime::IsZero(&local_30), !bVar1)) {
      bVar1 = RTPTime::operator<=(&local_20,&local_30);
      if (bVar1) {
        return -1.0;
      }
      RTPTime::operator-=(&local_20,&local_30);
      uVar2 = RTCPSenderReportInfo::GetRTPTimestamp(&this->SRinf);
      uVar3 = RTCPSenderReportInfo::GetRTPTimestamp(&this->SRprevinf);
      dVar4 = RTPTime::GetDouble(&local_20);
      return dVar4 / (double)(uVar2 - uVar3);
    }
  }
  return -1.0;
}

Assistant:

double RTPSourceData::INF_GetEstimatedTimestampUnit() const
{
	if (!SRprevinf.HasInfo())
		return -1.0;
	
	RTPTime t1 = RTPTime(SRinf.GetNTPTimestamp());
	RTPTime t2 = RTPTime(SRprevinf.GetNTPTimestamp());
	if (t1.IsZero() || t2.IsZero()) // one of the times couldn't be calculated
		return -1.0;

	if (t1 <= t2)
		return -1.0;

	t1 -= t2; // get the time difference
	
	uint32_t tsdiff = SRinf.GetRTPTimestamp()-SRprevinf.GetRTPTimestamp();
	
	return (t1.GetDouble()/((double)tsdiff));
}